

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O0

bool __thiscall QStringView::startsWith(QStringView *this,QStringView s,CaseSensitivity cs)

{
  QStringView needle;
  QStringView haystack;
  bool bVar1;
  CaseSensitivity in_ECX;
  qsizetype in_RDX;
  storage_type_conflict *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  storage_type_conflict *psVar2;
  
  psVar2 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  haystack.m_data = psVar2;
  haystack.m_size = in_RDX;
  needle.m_data = in_RSI;
  needle.m_size = *(qsizetype *)(in_RDI + 8);
  bVar1 = QtPrivate::startsWith(haystack,needle,in_ECX);
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) == psVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] bool startsWith(QStringView s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::startsWith(*this, s, cs); }